

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O3

void Amap_ManMergeNodeChoice(Amap_Man_t *p,Amap_Obj_t *pNode)

{
  uint uVar1;
  Amap_Cut_t AVar2;
  uint uVar3;
  Amap_Obj_t *pAVar4;
  Amap_Cut_t *pCut;
  
  pAVar4 = pNode;
  if (pNode != (Amap_Obj_t *)0x0) {
    do {
      pCut = (Amap_Cut_t *)(pAVar4->field_11).pData;
      uVar1 = *(uint *)&pAVar4->field_0x8;
      if (pCut != (Amap_Cut_t *)0x0 && 0xfff < uVar1) {
        uVar3 = 0;
        do {
          AVar2 = *pCut;
          if (AVar2._0_2_ != 0) {
            Amap_ManCutStore(p,pCut,((uint)((ulong)*(undefined8 *)pAVar4 >> 0x20) ^
                                    (uint)((ulong)*(undefined8 *)pNode >> 0x20)) >> 0x1d & 1);
            AVar2 = *pCut;
            uVar1 = *(uint *)&pAVar4->field_0x8;
          }
          uVar3 = uVar3 + 1;
          pCut = pCut + (ulong)((uint)AVar2 >> 0x11) + 1;
        } while (uVar3 < uVar1 >> 0xc);
      }
      (pAVar4->field_11).pData = (void *)0x0;
      uVar1 = pAVar4->Equiv;
      if ((ulong)uVar1 == 0) break;
      if (((int)uVar1 < 0) || (p->vObjs->nSize <= (int)uVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pAVar4 = (Amap_Obj_t *)p->vObjs->pArray[uVar1];
    } while (pAVar4 != (Amap_Obj_t *)0x0);
  }
  Amap_ManCutSaveStored(p,pNode);
  return;
}

Assistant:

void Amap_ManMergeNodeChoice( Amap_Man_t * p, Amap_Obj_t * pNode )
{
    Amap_Obj_t * pTemp;
    Amap_Cut_t * pCut;
    int c;
    // go through the nodes of the choice node
    for ( pTemp = pNode; pTemp; pTemp = Amap_ObjChoice(p, pTemp) )
    {
        Amap_NodeForEachCut( pTemp, pCut, c )
        {
            if (!pCut) break;   // mikelee added; abort when pCut is NULL
            if ( pCut->iMat )
                Amap_ManCutStore( p, pCut, pNode->fPhase ^ pTemp->fPhase );
        }
        pTemp->pData = NULL;
    }
    Amap_ManCutSaveStored( p, pNode );

//    Amap_ManPrintCuts( pNode );
}